

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

FunctionInfo *
Js::DynamicProfileInfo::GetFunctionInfo
          (FunctionBody *functionBody,SourceId sourceId,LocalFunctionId functionId)

{
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar1;
  code *pcVar2;
  bool bVar3;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  ScriptContext *pSVar6;
  Type *pTVar7;
  DWORD_PTR DVar8;
  FunctionInfo *pFVar9;
  FunctionBody *pFVar10;
  int i;
  int iVar11;
  Utf8SourceInfo *this;
  
  pTVar4 = ThreadContext::GetContextForCurrentThread();
  if (pTVar4 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x413,"(ThreadContext::GetContextForCurrentThread())",
                                "ThreadContext::GetContextForCurrentThread()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  switch(sourceId) {
  case 0xfffffffb:
    pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    pLVar1 = (pSVar6->sourceList).ptr;
    for (iVar11 = 0;
        iVar11 < (pLVar1->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).count; iVar11 = iVar11 + 1) {
      bVar3 = JsUtil::
              List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
              ::IsItemValid(pLVar1,iVar11);
      if (bVar3) {
        pTVar7 = JsUtil::
                 List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                 ::Item(pLVar1,iVar11);
        this = (Utf8SourceInfo *)(pTVar7->ptr->super_RecyclerWeakReferenceBase).strongRef;
        if ((this != (Utf8SourceInfo *)0x0) &&
           (DVar8 = Utf8SourceInfo::GetHostSourceContext(this), DVar8 == 0xfffffffffffffffe))
        goto LAB_00887360;
      }
    }
  default:
    pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    pLVar1 = (pSVar6->sourceList).ptr;
    for (iVar11 = 0;
        iVar11 < (pLVar1->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).count; iVar11 = iVar11 + 1) {
      bVar3 = JsUtil::
              List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
              ::IsItemValid(pLVar1,iVar11);
      if (bVar3) {
        pTVar7 = JsUtil::
                 List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                 ::Item(pLVar1,iVar11);
        this = (Utf8SourceInfo *)(pTVar7->ptr->super_RecyclerWeakReferenceBase).strongRef;
        if ((this != (Utf8SourceInfo *)0x0) &&
           (DVar8 = Utf8SourceInfo::GetHostSourceContext(this), DVar8 == sourceId))
        goto LAB_00887360;
      }
    }
    break;
  case 0xfffffffc:
  case 0xffffffff:
    break;
  case 0xfffffffd:
    this = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
LAB_00887360:
    pFVar10 = Utf8SourceInfo::FindFunction(this,functionId);
    if (pFVar10 != (FunctionBody *)0x0) {
      return (pFVar10->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    break;
  case 0xfffffffe:
    pFVar9 = JavascriptBuiltInFunction::GetFunctionInfo(functionId);
    return pFVar9;
  }
  return (FunctionInfo *)0x0;
}

Assistant:

FunctionInfo * DynamicProfileInfo::GetFunctionInfo(FunctionBody* functionBody, Js::SourceId sourceId, Js::LocalFunctionId functionId)
    {
        Assert(ThreadContext::GetContextForCurrentThread());
        if (sourceId == BuiltInSourceId)
        {
            return JavascriptBuiltInFunction::GetFunctionInfo(functionId);
        }

        if (sourceId == CurrentSourceId) // caller and callee in same file
        {
            FunctionProxy *inlineeProxy = functionBody->GetUtf8SourceInfo()->FindFunction(functionId);
            return inlineeProxy ? inlineeProxy->GetFunctionInfo() : nullptr;
        }

        if (sourceId == JsBuiltInSourceId)
        {
            // For call across files find the function from the right source
            JsUtil::List<RecyclerWeakReference<Utf8SourceInfo>*, Recycler, false, Js::FreeListedRemovePolicy> * sourceList = functionBody->GetScriptContext()->GetSourceList();
            for (int i = 0; i < sourceList->Count(); i++)
            {
                if (sourceList->IsItemValid(i))
                {
                    Utf8SourceInfo *srcInfo = sourceList->Item(i)->Get();
                    if (srcInfo && srcInfo->GetHostSourceContext() == Js::Constants::JsBuiltInSourceContext)
                    {
                        FunctionProxy *inlineeProxy = srcInfo->FindFunction(functionId);
                        if (inlineeProxy)
                        {
                            return inlineeProxy->GetFunctionInfo();
                        }
                        else
                        {
                            return nullptr;
                        }
                    }
                }
            }
        }

        if (sourceId != NoSourceId && sourceId != InvalidSourceId)
        {
            // For call across files find the function from the right source
            JsUtil::List<RecyclerWeakReference<Utf8SourceInfo>*, Recycler, false, Js::FreeListedRemovePolicy> * sourceList = functionBody->GetScriptContext()->GetSourceList();
            for (int i = 0; i < sourceList->Count(); i++)
            {
                if (sourceList->IsItemValid(i))
                {
                    Utf8SourceInfo *srcInfo = sourceList->Item(i)->Get();
                    if (srcInfo && srcInfo->GetHostSourceContext() == sourceId)
                    {
                        FunctionProxy *inlineeProxy = srcInfo->FindFunction(functionId);
                        return inlineeProxy ? inlineeProxy->GetFunctionInfo() : nullptr;
                    }
                }
            }
        }

        return nullptr;
    }